

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

size_t flatbuffers::InlineSize(Type *type)

{
  bool bVar1;
  size_t local_40;
  size_t local_38;
  Type local_30;
  Type *local_10;
  Type *type_local;
  
  local_10 = type;
  bVar1 = IsStruct(type);
  if (bVar1) {
    local_38 = local_10->struct_def->bytesize;
  }
  else {
    bVar1 = IsArray(local_10);
    if (bVar1) {
      Type::VectorType(&local_30,local_10);
      local_40 = InlineSize(&local_30);
      local_40 = local_40 * local_10->fixed_length;
    }
    else {
      local_40 = SizeOf(local_10->base_type);
    }
    local_38 = local_40;
  }
  return local_38;
}

Assistant:

inline size_t InlineSize(const Type &type) {
  return IsStruct(type)
             ? type.struct_def->bytesize
             : (IsArray(type)
                    ? InlineSize(type.VectorType()) * type.fixed_length
                    : SizeOf(type.base_type));
}